

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O0

Result wabt::anon_unknown_0::FloatParser<float>::ParseNan(char *s,char *end,Uint *out_bits)

{
  bool bVar1;
  Result result;
  Uint UVar2;
  uint32_t local_34;
  uint local_30;
  uint32_t digit;
  Uint tag;
  bool is_neg;
  Uint *out_bits_local;
  char *end_local;
  char *s_local;
  
  digit._3_1_ = 0;
  if (*s == '-') {
    digit._3_1_ = 1;
    end_local = s + 1;
  }
  else {
    end_local = s;
    if (*s == '+') {
      end_local = s + 1;
    }
  }
  _tag = out_bits;
  out_bits_local = (Uint *)end;
  bVar1 = StringStartsWith(end_local,end,"nan");
  if (!bVar1) {
    __assert_fail("StringStartsWith(s, end, \"nan\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/literal.cc"
                  ,0xd9,
                  "static Result wabt::(anonymous namespace)::FloatParser<float>::ParseNan(const char *, const char *, Uint *) [T = float]"
                 );
  }
  end_local = end_local + 3;
  if ((Uint *)end_local == out_bits_local) {
    local_30 = 0x400000;
  }
  else {
    local_30 = 0;
    bVar1 = StringStartsWith(end_local,(char *)out_bits_local,":0x");
    if (!bVar1) {
      __assert_fail("StringStartsWith(s, end, \":0x\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/literal.cc"
                    ,0xdf,
                    "static Result wabt::(anonymous namespace)::FloatParser<float>::ParseNan(const char *, const char *, Uint *) [T = float]"
                   );
    }
    for (end_local = end_local + 3; end_local < out_bits_local; end_local = end_local + 1) {
      if (*end_local != '_') {
        result = ParseHexdigit(*end_local,&local_34);
        bVar1 = Failed(result);
        if (bVar1) {
          Result::Result((Result *)((long)&s_local + 4),Error);
          return (Result)s_local._4_4_;
        }
        local_30 = local_30 * 0x10 + local_34;
        if (0x7fffff < local_30) {
          Result::Result((Result *)((long)&s_local + 4),Error);
          return (Result)s_local._4_4_;
        }
      }
    }
    if (local_30 == 0) {
      Result::Result((Result *)((long)&s_local + 4),Error);
      return (Result)s_local._4_4_;
    }
  }
  UVar2 = Make((bool)(digit._3_1_ & 1),0x80,local_30);
  *_tag = UVar2;
  Result::Result((Result *)((long)&s_local + 4),Ok);
  return (Result)s_local._4_4_;
}

Assistant:

Result FloatParser<T>::ParseNan(const char* s,
                                const char* end,
                                Uint* out_bits) {
  bool is_neg = false;
  if (*s == '-') {
    is_neg = true;
    s++;
  } else if (*s == '+') {
    s++;
  }
  assert(StringStartsWith(s, end, "nan"));
  s += 3;

  Uint tag;
  if (s != end) {
    tag = 0;
    assert(StringStartsWith(s, end, ":0x"));
    s += 3;

    for (; s < end; ++s) {
      if (*s == '_') {
        continue;
      }
      uint32_t digit;
      CHECK_RESULT(ParseHexdigit(*s, &digit));
      tag = tag * 16 + digit;
      // Check for overflow.
      if (tag > Traits::kSigMask) {
        return Result::Error;
      }
    }

    // NaN cannot have a zero tag, that is reserved for infinity.
    if (tag == 0) {
      return Result::Error;
    }
  } else {
    tag = Traits::kQuietNanTag;
  }

  *out_bits = Make(is_neg, Traits::kMaxExp, tag);
  return Result::Ok;
}